

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O0

bool __thiscall Rml::DataModel::BindVariable(DataModel *this,String *name,DataVariable variable)

{
  bool bVar1;
  undefined8 uVar2;
  pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::DataVariable,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
  local_58;
  byte local_39;
  char *pcStack_38;
  bool inserted;
  char *name_error_str;
  String *name_local;
  DataModel *this_local;
  DataVariable variable_local;
  
  variable_local.definition = (VariableDefinition *)variable.ptr;
  this_local = (DataModel *)variable.definition;
  name_error_str = (char *)name;
  name_local = (String *)this;
  pcStack_38 = LegalVariableName(name);
  if (pcStack_38 == (char *)0x0) {
    bVar1 = DataVariable::operator_cast_to_bool((DataVariable *)&this_local);
    if (bVar1) {
      robin_hood::detail::
      Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
      ::emplace<std::__cxx11::string_const&,Rml::DataVariable&>
                (&local_58,
                 (Table<true,80ul,std::__cxx11::string,Rml::DataVariable,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                  *)&this->variables,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)name_error_str
                 ,(DataVariable *)&this_local);
      local_39 = local_58.second & 1;
      if (local_39 == 0) {
        uVar2 = ::std::__cxx11::string::c_str();
        Log::Message(LT_WARNING,"Data model variable with name \'%s\' already exists.",uVar2);
        variable_local.ptr._7_1_ = false;
      }
      else {
        variable_local.ptr._7_1_ = true;
      }
    }
    else {
      uVar2 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,
                   "Could not bind variable \'%s\' to data model, data type not registered.",uVar2);
      variable_local.ptr._7_1_ = false;
    }
  }
  else {
    uVar2 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"Could not bind data variable \'%s\'. %s",uVar2,pcStack_38);
    variable_local.ptr._7_1_ = false;
  }
  return variable_local.ptr._7_1_;
}

Assistant:

bool DataModel::BindVariable(const String& name, DataVariable variable)
{
	const char* name_error_str = LegalVariableName(name);
	if (name_error_str)
	{
		Log::Message(Log::LT_WARNING, "Could not bind data variable '%s'. %s", name.c_str(), name_error_str);
		return false;
	}

	if (!variable)
	{
		Log::Message(Log::LT_WARNING, "Could not bind variable '%s' to data model, data type not registered.", name.c_str());
		return false;
	}

	bool inserted = variables.emplace(name, variable).second;
	if (!inserted)
	{
		Log::Message(Log::LT_WARNING, "Data model variable with name '%s' already exists.", name.c_str());
		return false;
	}

	return true;
}